

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteBeginFunc(WatWriter *this,Func *func)

{
  Index index;
  Module *this_00;
  bool bVar1;
  Location local_90;
  Var local_70;
  string_view local_28;
  Func *local_18;
  Func *func_local;
  WatWriter *this_local;
  
  local_18 = func;
  func_local = (Func *)this;
  WriteOpenSpace(this,"func");
  local_28 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_18);
  WriteNameOrIndex(this,local_28,this->func_index_,Space);
  WriteInlineExports(this,First,this->func_index_);
  WriteInlineImport(this,First,this->func_index_);
  if (((local_18->decl).has_func_type & 1U) != 0) {
    WriteOpenSpace(this,"type");
    WriteVar(this,&(local_18->decl).type_var,None);
    WriteCloseSpace(this);
  }
  this_00 = (this->super_ModuleContext).module;
  index = this->func_index_;
  Location::Location(&local_90);
  Var::Var(&local_70,index,&local_90);
  bVar1 = Module::IsImport(this_00,First,&local_70);
  Var::~Var(&local_70);
  if ((bVar1) &&
     (((this->options_->inline_import & 1U) != 0 || (((local_18->decl).has_func_type & 1U) == 0))))
  {
    WriteFuncSigSpace(this,&(local_18->decl).sig);
  }
  this->func_index_ = this->func_index_ + 1;
  return;
}

Assistant:

void WatWriter::WriteBeginFunc(const Func& func) {
  WriteOpenSpace("func");
  WriteNameOrIndex(func.name, func_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Func, func_index_);
  WriteInlineImport(ExternalKind::Func, func_index_);
  if (func.decl.has_func_type) {
    WriteOpenSpace("type");
    WriteVar(func.decl.type_var, NextChar::None);
    WriteCloseSpace();
  }

  if (module.IsImport(ExternalKind::Func, Var(func_index_, Location()))) {
    // Imported functions can be written a few ways:
    //
    //   1. (import "module" "field" (func (type 0)))
    //   2. (import "module" "field" (func (param i32) (result i32)))
    //   3. (func (import "module" "field") (type 0))
    //   4. (func (import "module" "field") (param i32) (result i32))
    //   5. (func (import "module" "field") (type 0) (param i32) (result i32))
    //
    // Note that the text format does not allow including the param/result
    // explicitly when using the "(import..." syntax (#1 and #2).
    if (options_.inline_import || !func.decl.has_func_type) {
      WriteFuncSigSpace(func.decl.sig);
    }
  }
  func_index_++;
}